

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O2

void __thiscall nvim::Nvim::win_set_config(Nvim *this,Window window,Dictionary *config)

{
  allocator local_49;
  Window local_48;
  string local_40;
  
  local_48 = window;
  std::__cxx11::string::string((string *)&local_40,"nvim_win_set_config",&local_49);
  NvimRPC::
  call<long,std::multimap<msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>,msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>,std::less<msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>>,std::allocator<std::pair<msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>const,msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>>>>>
            (&this->client_,&local_40,(nullptr_t)0x0,&local_48,config);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void Nvim::win_set_config(Window window, const Dictionary& config) {
    client_.call("nvim_win_set_config", nullptr, window, config);
}